

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O0

base_learner * svrg_setup(options_i *options,vw *all)

{
  typed_option<bool> *this;
  typed_option<int> *op;
  pointer psVar1;
  learner<SVRG::svrg,_example> *this_00;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<SVRG::svrg,_example> *l;
  option_group_definition new_options;
  bool svrg_option;
  free_ptr<SVRG::svrg> s;
  undefined4 in_stack_fffffffffffffcf8;
  uint32_t in_stack_fffffffffffffcfc;
  typed_option<bool> *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint32_t in_stack_fffffffffffffd14;
  typed_option<bool> *in_stack_fffffffffffffd48;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  byte local_29;
  vw *local_18;
  undefined8 *local_10;
  typed_option<bool> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<SVRG::svrg>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Stochastic Variance Reduced Gradient",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd00,
             (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"svrg",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffffd08,(bool *)in_stack_fffffffffffffd00);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_188,"Streaming Stochastic Variance Reduced Gradient",&local_189);
  this = VW::config::typed_option<bool>::help
                   (in_stack_fffffffffffffd00,
                    (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  op = (typed_option<int> *)
       VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                 ((option_group_definition *)this,in_stack_fffffffffffffd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"stage_size",&local_251);
  std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::operator->
            ((unique_ptr<SVRG::svrg,_void_(*)(void_*)> *)0x378fc8);
  VW::config::make_option<int>(in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"Number of passes per SVRG stage",&local_279);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffffd00,
             (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)this,op);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (typed_option<bool> *)0x0;
  }
  else {
    psVar1 = std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::operator->
                       ((unique_ptr<SVRG::svrg,_void_(*)(void_*)> *)0x37930c);
    psVar1->all = local_18;
    psVar1 = std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::operator->
                       ((unique_ptr<SVRG::svrg,_void_(*)(void_*)> *)0x37931f);
    psVar1->prev_pass = -1;
    psVar1 = std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::operator->
                       ((unique_ptr<SVRG::svrg,_void_(*)(void_*)> *)0x379330);
    psVar1->stable_grad_count = 0;
    parameters::stride_shift((parameters *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    in_stack_fffffffffffffd14 =
         parameters::stride_shift
                   ((parameters *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    this_00 = LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
                        ((free_ptr<SVRG::svrg> *)
                         CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                         (_func_void_svrg_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd08,
                         (_func_void_svrg_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd00,
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    LEARNER::learner<SVRG::svrg,_example>::set_save_load(this_00,SVRG::save_load);
    in_stack_fffffffffffffd00 =
         (typed_option<bool> *)LEARNER::make_base<SVRG::svrg,example>(this_00);
    local_8 = in_stack_fffffffffffffd00;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd00);
  std::unique_ptr<SVRG::svrg,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<SVRG::svrg,_void_(*)(void_*)> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  return (base_learner *)local_8;
}

Assistant:

base_learner* svrg_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<svrg>();

  bool svrg_option = false;
  option_group_definition new_options("Stochastic Variance Reduced Gradient");
  new_options.add(make_option("svrg", svrg_option).keep().help("Streaming Stochastic Variance Reduced Gradient"))
      .add(make_option("stage_size", s->stage_size).default_value(1).help("Number of passes per SVRG stage"));
  options.add_and_parse(new_options);

  if (!svrg_option)
  {
    return nullptr;
  }

  s->all = &all;
  s->prev_pass = -1;
  s->stable_grad_count = 0;

  // Request more parameter storage (4 floats per feature)
  all.weights.stride_shift(2);
  learner<svrg, example>& l = init_learner(s, learn, predict, UINT64_ONE << all.weights.stride_shift());
  l.set_save_load(save_load);
  return make_base(l);
}